

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_alpha.cpp
# Opt level: O3

void __thiscall QAlphaPaintEngine::flushAndInit(QAlphaPaintEngine *this,bool init)

{
  QAlphaPaintEnginePrivate *this_00;
  qreal qVar1;
  QPen *pQVar2;
  QBrush *pQVar3;
  QFont *pQVar4;
  long lVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  QRegion *pQVar11;
  QPainter *pQVar12;
  QTransform *pQVar13;
  QPointF *pQVar14;
  undefined8 *puVar15;
  undefined8 *puVar16;
  QPicture *this_01;
  QPaintEngine *pQVar17;
  undefined8 uVar18;
  long *plVar19;
  long lVar20;
  QAlphaPaintEnginePrivate *pQVar21;
  QRect *rect;
  long in_FS_OFFSET;
  byte bVar22;
  double dVar23;
  QRegion oldAlphaRegion;
  QTransform mtx;
  undefined1 local_b8 [16];
  double local_a8;
  double local_a0;
  undefined8 local_90;
  undefined1 local_88 [12];
  int iStack_7c;
  undefined2 local_40;
  long local_38;
  
  bVar22 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAlphaPaintEnginePrivate **)&this->field_0x18;
  if (this_00->m_pic != (QPicture *)0x0) {
    QPainter::end();
    pQVar11 = &this_00->m_alphargn;
    iVar7 = (**(code **)(*(long *)this_00->m_pdev + 0x20))(this_00->m_pdev,1);
    iVar8 = (**(code **)(*(long *)this_00->m_pdev + 0x20))(this_00->m_pdev,2);
    local_88._0_8_ = 0;
    stack0xffffffffffffff80 = (double)CONCAT44(iVar8 + -1,iVar7 + -1);
    QRegion::intersected((QRect *)local_b8);
    qVar1 = *(qreal *)&this_00->m_alphargn;
    *(undefined8 *)&this_00->m_alphargn = local_b8._0_8_;
    local_b8._0_8_ = qVar1;
    QRegion::~QRegion((QRegion *)local_b8);
    iVar7 = QRegion::rectCount();
    if (10 < iVar7) {
      _local_88 = QRegion::boundingRect();
      QRegion::QRegion((QRegion *)local_b8,local_88,0);
      qVar1 = *(qreal *)pQVar11;
      *(undefined8 *)pQVar11 = local_b8._0_8_;
      local_b8._0_8_ = qVar1;
      QRegion::~QRegion((QRegion *)local_b8);
    }
    local_90 = 0xaaaaaaaaaaaaaaaa;
    pQVar11 = (QRegion *)QRegion::operator=(&this_00->m_cliprgn,pQVar11);
    QRegion::QRegion((QRegion *)&local_90,pQVar11);
    this_00->m_pass = this_00->m_pass + 1;
    *(Int *)&this->field_0x10 =
         (this_00->m_savedcaps).super_QFlagsStorageHelper<QPaintEngine::PaintEngineFeature,_4>.
         super_QFlagsStorage<QPaintEngine::PaintEngineFeature>.i;
    QPaintEngine::painter();
    QPainter::save();
    pQVar21 = (QAlphaPaintEnginePrivate *)this;
    pQVar12 = (QPainter *)QPaintEngine::painter();
    QAlphaPaintEnginePrivate::resetState(pQVar21,pQVar12);
    puVar15 = &DAT_0014d050;
    puVar16 = (undefined8 *)local_88;
    for (lVar20 = 10; lVar20 != 0; lVar20 = lVar20 + -1) {
      *puVar16 = *puVar15;
      puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
      puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
    }
    puVar15 = &DAT_0014d0d0;
    puVar16 = (undefined8 *)local_88;
    for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
      *puVar16 = *puVar15;
      puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
      puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
    }
    local_40 = 0xa800;
    iVar7 = (**(code **)(*(long *)this_00->m_pdev + 0x20))(this_00->m_pdev,7);
    iVar8 = qt_defaultDpiX();
    iVar9 = (**(code **)(*(long *)this_00->m_pdev + 0x20))(this_00->m_pdev,8);
    iVar10 = qt_defaultDpiY();
    QTransform::scale(1.0 / ((double)iVar7 / (double)iVar8),1.0 / ((double)iVar9 / (double)iVar10));
    pQVar13 = (QTransform *)QPaintEngine::painter();
    QPainter::setTransform(pQVar13,SUB81(local_88,0));
    pQVar14 = (QPointF *)QPaintEngine::painter();
    local_b8 = ZEXT816(0);
    QPainter::drawPicture(pQVar14,(QPicture *)local_b8);
    QRegion::QRegion((QRegion *)local_b8);
    uVar18 = *(undefined8 *)&this_00->m_cliprgn;
    *(undefined8 *)&this_00->m_cliprgn = local_b8._0_8_;
    local_b8._0_8_ = uVar18;
    QRegion::~QRegion((QRegion *)local_b8);
    pQVar21 = (QAlphaPaintEnginePrivate *)this;
    pQVar12 = (QPainter *)QPaintEngine::painter();
    QAlphaPaintEnginePrivate::resetState(pQVar21,pQVar12);
    puVar15 = (undefined8 *)QRegion::begin();
    puVar16 = (undefined8 *)QRegion::end();
    if (puVar15 != puVar16) {
      do {
        iVar7 = (int)*puVar15;
        iVar8 = (int)((ulong)*puVar15 >> 0x20);
        dVar23 = (double)iVar8;
        local_b8._8_4_ = SUB84(dVar23,0);
        local_b8._0_8_ = (double)iVar7;
        local_b8._12_4_ = (int)((ulong)dVar23 >> 0x20);
        local_a8 = (double)(((long)*(int *)(puVar15 + 1) - (long)iVar7) + 1);
        local_a0 = (double)(((long)*(int *)((long)puVar15 + 0xc) - (long)iVar8) + 1);
        QAlphaPaintEnginePrivate::drawAlphaImage(this_00,(QRectF *)local_b8);
        puVar15 = puVar15 + 2;
      } while (puVar15 != puVar16);
    }
    QRegion::QRegion((QRegion *)local_b8);
    uVar18 = *(undefined8 *)&this_00->m_alphargn;
    *(undefined8 *)&this_00->m_alphargn = local_b8._0_8_;
    local_b8._0_8_ = uVar18;
    QRegion::~QRegion((QRegion *)local_b8);
    QPaintEngine::painter();
    QPainter::restore();
    this_00->m_pass = this_00->m_pass + -1;
    cleanUp(this);
    QRegion::~QRegion((QRegion *)&local_90);
  }
  if (init) {
    *(undefined4 *)&this->field_0x10 = 0xfffeffff;
    this_01 = (QPicture *)operator_new(0x18);
    QPicture::QPicture(this_01,-1);
    this_00->m_pic = this_01;
    *(undefined1 *)(*(long *)(this_01 + 0x10) + 0x50) = 1;
    pQVar12 = (QPainter *)operator_new(8);
    QPainter::QPainter(pQVar12,(QPaintDevice *)this_01);
    this_00->m_picpainter = pQVar12;
    pQVar17 = (QPaintEngine *)QPainter::paintEngine();
    this_00->m_picengine = pQVar17;
    pQVar2 = (QPen *)this_00->m_picpainter;
    QPaintEngine::painter();
    QPainter::pen();
    QPainter::setPen(pQVar2);
    pQVar3 = (QBrush *)this_00->m_picpainter;
    QPaintEngine::painter();
    QPainter::brush();
    QPainter::setBrush(pQVar3);
    pQVar14 = (QPointF *)this_00->m_picpainter;
    QPaintEngine::painter();
    uVar18 = QPainter::brushOrigin();
    local_88._0_8_ = (undefined8)(int)uVar18;
    register0x00001200 = (double)(int)((ulong)uVar18 >> 0x20);
    QPainter::setBrushOrigin(pQVar14);
    pQVar4 = (QFont *)this_00->m_picpainter;
    QPaintEngine::painter();
    QPainter::font();
    QPainter::setFont(pQVar4);
    QPaintEngine::painter();
    dVar23 = (double)QPainter::opacity();
    QPainter::setOpacity(dVar23);
    pQVar12 = this_00->m_picpainter;
    QPaintEngine::painter();
    QPainter::combinedTransform();
    QPainter::setTransform((QTransform *)pQVar12,SUB81(local_88,0));
    QPaintEngine::syncState();
    lVar20 = *(long *)(*(long *)this_00->m_picpainter + 0x40);
    if (lVar20 == 0) {
      flushAndInit();
    }
    else {
      uVar18 = *(undefined8 *)(lVar20 + 0x1a8);
      plVar19 = (long *)QPaintEngine::painter();
      lVar5 = *(long *)(*plVar19 + 0x40);
      if (lVar5 != 0) {
        *(undefined4 *)(lVar20 + 8) = *(undefined4 *)(lVar5 + 8);
        uVar6 = *(undefined8 *)(lVar5 + 0x18);
        *(undefined8 *)(lVar20 + 0x10) = *(undefined8 *)(lVar5 + 0x10);
        *(undefined8 *)(lVar20 + 0x18) = uVar6;
        QFont::operator=((QFont *)(lVar20 + 0x20),(QFont *)(lVar5 + 0x20));
        QFont::operator=((QFont *)(lVar20 + 0x30),(QFont *)(lVar5 + 0x30));
        QPen::operator=((QPen *)(lVar20 + 0x40),(QPen *)(lVar5 + 0x40));
        QBrush::operator=((QBrush *)(lVar20 + 0x48),(QBrush *)(lVar5 + 0x48));
        QBrush::operator=((QBrush *)(lVar20 + 0x50),(QBrush *)(lVar5 + 0x50));
        QRegion::operator=((QRegion *)(lVar20 + 0x58),(QRegion *)(lVar5 + 0x58));
        QPainterPath::operator=((QPainterPath *)(lVar20 + 0x60),(QPainterPath *)(lVar5 + 0x60));
        *(undefined8 *)(lVar20 + 0x68) = *(undefined8 *)(lVar5 + 0x68);
        QArrayDataPointer<QPainterClipInfo>::operator=
                  ((QArrayDataPointer<QPainterClipInfo> *)(lVar20 + 0x70),
                   (QArrayDataPointer<QPainterClipInfo> *)(lVar5 + 0x70));
        memcpy((void *)(lVar20 + 0x88),(void *)(lVar5 + 0x88),0x138);
        *(undefined8 *)(lVar20 + 0x1a8) = uVar18;
        goto LAB_00129837;
      }
    }
    flushAndInit();
  }
  else {
LAB_00129837:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QAlphaPaintEngine::flushAndInit(bool init)
{
    Q_D(QAlphaPaintEngine);
    Q_ASSERT(d->m_pass == 0);

    if (d->m_pic) {
        d->m_picpainter->end();

        // set clip region
        d->m_alphargn = d->m_alphargn.intersected(QRect(0, 0, d->m_pdev->width(), d->m_pdev->height()));

        // just use the bounding rect if it's a complex region..
        if (d->m_alphargn.rectCount() > 10) {
            QRect br = d->m_alphargn.boundingRect();
            d->m_alphargn = QRegion(br);
        }

        const auto oldAlphaRegion = d->m_cliprgn = d->m_alphargn;

        // now replay the QPicture
        ++d->m_pass; // we are now doing pass #2

        // reset states
        gccaps = d->m_savedcaps;

        painter()->save();
        d->resetState(painter());

        // make sure the output from QPicture is unscaled
        QTransform mtx;
        mtx.scale(1.0f / (qreal(d->m_pdev->logicalDpiX()) / qreal(qt_defaultDpiX())),
                  1.0f / (qreal(d->m_pdev->logicalDpiY()) / qreal(qt_defaultDpiY())));
        painter()->setTransform(mtx);
        painter()->drawPicture(0, 0, *d->m_pic);

        d->m_cliprgn = QRegion();
        d->resetState(painter());

        // fill in the alpha images
        for (const auto &rect : oldAlphaRegion)
            d->drawAlphaImage(rect);

        d->m_alphargn = QRegion();

        painter()->restore();

        --d->m_pass; // pass #2 finished

        cleanUp();
    }

    if (init) {
        gccaps = PaintEngineFeatures(AllFeatures & ~QPaintEngine::ObjectBoundingModeGradients);

        d->m_pic = new QPicture();
        d->m_pic->d_ptr->in_memory_only = true;
        d->m_picpainter = new QPainter(d->m_pic);
        d->m_picengine = d->m_picpainter->paintEngine();

        // When newPage() is called and the m_picpainter is recreated
        // we have to copy the current state of the original printer
        // painter back to the m_picpainter
        d->m_picpainter->setPen(painter()->pen());
        d->m_picpainter->setBrush(painter()->brush());
        d->m_picpainter->setBrushOrigin(painter()->brushOrigin());
        d->m_picpainter->setFont(painter()->font());
        d->m_picpainter->setOpacity(painter()->opacity());
        d->m_picpainter->setTransform(painter()->combinedTransform());
        d->m_picengine->syncState();
        QPainterState &state = *d->m_picpainter->d_func()->state;
        QPainter *oldPainter = state.painter;
        state = *painter()->d_func()->state;
        state.painter = oldPainter;
    }
}